

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFExporter.cpp
# Opt level: O3

void __thiscall Assimp::D3MF::D3MFExporter::writeMetaData(D3MFExporter *this)

{
  uint uVar1;
  aiMetadata *paVar2;
  uint *puVar3;
  D3MFExporter *pDVar4;
  int iVar5;
  ostream *poVar6;
  ostream *poVar7;
  ulong uVar8;
  long lVar9;
  char *pcVar10;
  ulong __n;
  size_t sVar11;
  string k;
  aiString value;
  aiString *local_880;
  long *local_878;
  ulong local_870;
  long local_868 [2];
  D3MFExporter *local_858;
  ostream *local_850;
  ulong local_848;
  char *local_840;
  uint local_838;
  char local_834 [1024];
  allocator<char> local_434 [4];
  undefined1 local_430 [1024];
  
  paVar2 = this->mScene->mMetaData;
  if ((paVar2 != (aiMetadata *)0x0) && (local_848 = (ulong)paVar2->mNumProperties, local_848 != 0))
  {
    local_850 = (ostream *)&this->mModelOutput;
    uVar8 = 0;
    local_880 = (aiString *)0x0;
    local_858 = this;
    do {
      pDVar4 = local_858;
      paVar2 = local_858->mScene->mMetaData;
      if (uVar8 < paVar2->mNumProperties) {
        local_880 = paVar2->mKeys + uVar8;
      }
      local_840 = local_880->data;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_878,local_840,local_434);
      local_838 = 0;
      local_834[0] = '\0';
      memset(local_834 + 1,0x1b,0x3ff);
      paVar2 = pDVar4->mScene->mMetaData;
      sVar11 = local_870 & 0xffffffff;
      if ((local_870 & 0xfffffc00) != 0) {
        sVar11 = 0x3ff;
      }
      memcpy(local_430,local_878,sVar11);
      local_430[sVar11] = 0;
      uVar1 = paVar2->mNumProperties;
      if ((ulong)uVar1 != 0) {
        pcVar10 = paVar2->mKeys->data;
        lVar9 = 0;
        do {
          if ((((aiString *)(pcVar10 + -4))->length == (ai_uint32)sVar11) &&
             (iVar5 = bcmp(pcVar10,local_430,sVar11), iVar5 == 0)) {
            if ((*(int *)((long)&paVar2->mValues->mType + lVar9) == 5) &&
               (puVar3 = *(uint **)((long)&paVar2->mValues->mData + lVar9), puVar3 != &local_838)) {
              local_838 = *puVar3;
              __n = (ulong)local_838;
              memcpy(local_834,puVar3 + 1,__n);
              local_834[__n] = '\0';
            }
            break;
          }
          lVar9 = lVar9 + 0x10;
          pcVar10 = pcVar10 + 0x404;
        } while ((ulong)uVar1 << 4 != lVar9);
      }
      poVar7 = local_850;
      std::__ostream_insert<char,std::char_traits<char>>(local_850,"<",1);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,XmlTag::meta_abi_cxx11_,DAT_008abb08);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,XmlTag::meta_name_abi_cxx11_,DAT_008abb28);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"=\"",2);
      pcVar10 = local_840;
      sVar11 = strlen(local_840);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar10,sVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\">",2);
      sVar11 = strlen(local_834);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_834,sVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"</",2);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,XmlTag::meta_abi_cxx11_,DAT_008abb08);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,">",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      if (local_878 != local_868) {
        operator_delete(local_878,local_868[0] + 1);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != local_848);
  }
  return;
}

Assistant:

void D3MFExporter::writeMetaData() {
    if ( nullptr == mScene->mMetaData ) {
        return;
    }

    const unsigned int numMetaEntries( mScene->mMetaData->mNumProperties );
    if ( 0 == numMetaEntries ) {
        return;
    }

	const aiString *key = nullptr;
    const aiMetadataEntry *entry(nullptr);
    for ( size_t i = 0; i < numMetaEntries; ++i ) {
        mScene->mMetaData->Get( i, key, entry );
        std::string k( key->C_Str() );
        aiString value;
        mScene->mMetaData->Get(  k, value );
        mModelOutput << "<" << XmlTag::meta << " " << XmlTag::meta_name << "=\"" << key->C_Str() << "\">";
        mModelOutput << value.C_Str();
        mModelOutput << "</" << XmlTag::meta << ">" << std::endl;
    }
}